

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

void fl_xim_activate(Window xid)

{
  Fl_Window *in_stack_ffffffffffffffe8;
  
  if (fl_xim_im != (XIM)0x0) {
    if (fl_xim_win != xid) {
      if (fl_xim_ic != (XIC)0x0) {
        XDestroyIC();
        fl_xim_ic = (XIC)0x0;
        fl_xim_win = 0;
      }
      fl_new_ic();
      fl_xim_win = xid;
      XSetICValues(fl_xim_ic,"focusWindow",xid,"clientWindow",xid,0);
    }
    fl_set_spot(spotf,spots,(int)spot.x,(int)spot.y,(uint)spot.width,(uint)spot.height,
                in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void fl_xim_activate(Window xid) {
  if (!fl_xim_im)
    return;

  // If the focused window has changed, then use the brute force method
  // of completely recreating the input context.
  if (fl_xim_win != xid) {
    fl_xim_deactivate();

    fl_new_ic();
    fl_xim_win = xid;

    XSetICValues(fl_xim_ic,
                 XNFocusWindow, fl_xim_win,
                 XNClientWindow, fl_xim_win,
                 NULL);
  }

  fl_set_spot(spotf, spots, spot.x, spot.y, spot.width, spot.height);
}